

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  uint uVar1;
  nk_font_config local_f8;
  undefined1 local_a0 [8];
  nk_font_config cfg;
  void *decompressed_data;
  uint decompressed_size;
  nk_font_config *config_local;
  float height_local;
  nk_size compressed_size_local;
  void *compressed_data_local;
  nk_font_atlas *atlas_local;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3002,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3003,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3004,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free == (nk_plugin_free)0x0) {
      __assert_fail("atlas->permanent.free",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x3006,
                    "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                   );
    }
    if (compressed_data != (void *)0x0) {
      if (compressed_size == 0) {
        __assert_fail("compressed_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x3009,
                      "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                     );
      }
      if ((((atlas == (nk_font_atlas *)0x0) || (compressed_data == (void *)0x0)) ||
          ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)) ||
         ((((atlas->temporary).free == (nk_plugin_free)0x0 ||
           ((atlas->permanent).alloc == (nk_plugin_alloc)0x0)) ||
          ((atlas->permanent).free == (nk_plugin_free)0x0)))) {
        atlas_local = (nk_font_atlas *)0x0;
      }
      else {
        uVar1 = nk_decompress_length((uchar *)compressed_data);
        cfg.p = (nk_font_config *)
                (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,(nk_size)uVar1);
        if (cfg.p == (nk_font_config *)0x0) {
          __assert_fail("decompressed_data",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x3010,
                        "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                       );
        }
        if (cfg.p == (nk_font_config *)0x0) {
          atlas_local = (nk_font_atlas *)0x0;
        }
        else {
          nk_decompress((uchar *)cfg.p,(uchar *)compressed_data,(uint)compressed_size);
          if (config == (nk_font_config *)0x0) {
            nk_font_config(&local_f8,height);
            memcpy(local_a0,&local_f8,0x58);
          }
          else {
            memcpy(local_a0,config,0x58);
          }
          cfg.next = cfg.p;
          cfg.ttf_blob = (void *)(ulong)uVar1;
          cfg.ttf_size._0_1_ = 1;
          cfg._24_4_ = height;
          atlas_local = (nk_font_atlas *)nk_font_atlas_add(atlas,(nk_font_config *)local_a0);
        }
      }
      return (nk_font *)atlas_local;
    }
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3008,
                  "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x3005,
                "struct nk_font *nk_font_atlas_add_compressed(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
               );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
    void *compressed_data, nk_size compressed_size, float height,
    const struct nk_font_config *config)
{
    unsigned int decompressed_size;
    void *decompressed_data;
    struct nk_font_config cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(compressed_data);
    NK_ASSERT(compressed_size);
    if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
    decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
    NK_ASSERT(decompressed_data);
    if (!decompressed_data) return 0;
    nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
        (unsigned int)compressed_size);

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = decompressed_data;
    cfg.ttf_size = decompressed_size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 1;
    return nk_font_atlas_add(atlas, &cfg);
}